

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp_stress.c
# Opt level: O0

void entry(void *args0)

{
  double dVar1;
  double tmp_a15111_1;
  double tmp_a18111_1;
  double tmp_a19111_1;
  double tmp_a12111_1;
  double tmp_a19111;
  double tmp_a15111;
  double tmp_a18111;
  double tmp_a12111;
  double tmp_a3110_1;
  double tmp_a16110_1;
  double tmp_a17110_1;
  double tmp_a0110_1;
  double tmp_a17110;
  double tmp_a3110;
  double tmp_a16110;
  double tmp_a0110;
  double tmp_a13107_1;
  double tmp_a11107_1;
  double tmp_a15107_1;
  double tmp_a9107_1;
  double tmp_a15107;
  double tmp_a13107;
  double tmp_a11107;
  double tmp_a9107;
  double tmp_a12106_1;
  double tmp_a10106_1;
  double tmp_a14106_1;
  double tmp_a8106_1;
  double tmp_a14106;
  double tmp_a12106;
  double tmp_a10106;
  double tmp_a8106;
  double tmp_a5104_1;
  double tmp_a3104_1;
  double tmp_a7104_1;
  double tmp_a1104_1;
  double tmp_a7104;
  double tmp_a5104;
  double tmp_a3104;
  double tmp_a1104;
  double tmp_a4103_1;
  double tmp_a2103_1;
  double tmp_a6103_1;
  double tmp_a0103_1;
  double tmp_a6103;
  double tmp_a4103;
  double tmp_a2103;
  double tmp_a0103;
  int j;
  int i;
  double a19;
  double a18;
  double a17;
  double a16;
  double a15;
  double a14;
  double a13;
  double a12;
  double a11;
  double a10;
  double a9;
  double a8;
  double a7;
  double a6;
  double a5;
  double a4;
  double a3;
  double a2;
  double a1;
  double a0;
  Args *args;
  void *args0_local;
  
  a1 = A[0] + (double)*(int *)((long)args0 + 0x14);
  a2 = A[1] + (double)(*(int *)((long)args0 + 0x14) * 3);
  a3 = A[2] - (double)*(int *)((long)args0 + 0x14);
  a4 = A[3] - (double)(*(int *)((long)args0 + 0x14) * 3);
  a5 = A[4] + (double)*(int *)((long)args0 + 0x14);
  a6 = A[5] + (double)(*(int *)((long)args0 + 0x14) * 3);
  a7 = A[6] - (double)*(int *)((long)args0 + 0x14);
  a8 = A[7] - (double)(*(int *)((long)args0 + 0x14) * 3);
  a9 = A[8] + (double)*(int *)((long)args0 + 0x14);
  a10 = A[9] + (double)(*(int *)((long)args0 + 0x14) * 3);
  a11 = A[10] - (double)*(int *)((long)args0 + 0x14);
  a12 = A[0xb] - (double)(*(int *)((long)args0 + 0x14) * 3);
  a13 = A[0xc] + (double)*(int *)((long)args0 + 0x14);
  a14 = A[0xd] + (double)(*(int *)((long)args0 + 0x14) * 3);
  a15 = A[0xe] - (double)*(int *)((long)args0 + 0x14);
  a16 = A[0xf] - (double)(*(int *)((long)args0 + 0x14) * 3);
  a17 = A[0x10] + (double)*(int *)((long)args0 + 0x14);
  a18 = A[0x11] + (double)(*(int *)((long)args0 + 0x14) * 3);
  a19 = A[0x12] - (double)*(int *)((long)args0 + 0x14);
  _j = A[0x13] - (double)(*(int *)((long)args0 + 0x14) * 3);
  for (tmp_a0103._4_4_ = 0; tmp_a0103._4_4_ < *(int *)((long)args0 + 0x10);
      tmp_a0103._4_4_ = tmp_a0103._4_4_ + 1) {
    for (tmp_a0103._0_4_ = 0; (int)tmp_a0103._0_4_ < 0x10; tmp_a0103._0_4_ = tmp_a0103._0_4_ + 1) {
      if ((tmp_a0103._0_4_ & 1) == 0) {
        a9 = (a11 * a13 - a15 * 31.0) + 1.0;
        a11 = (a9 * a11 - a13 * a15 * 2.0) + 1.0;
        a13 = (a15 * a15 + a9 * 3.0) - 1.0;
        a15 = (((a9 + a11) - a13) - a15 * 11.0) - 1.0;
        while (24.0 < a9 * a9 + a11 * a11) {
          dVar1 = a9 + a11;
          a11 = (a9 - a11) * 0.05555555555555555;
          a9 = dVar1 * 0.058823529411764705;
        }
        while (27.0 < a13 * a13 + a15 * a15) {
          dVar1 = a13 + a15;
          a15 = (a13 - a15) * 0.05555555555555555;
          a13 = dVar1 * 0.058823529411764705;
        }
        while (29.0 < a9 * a9 + a15 * a15) {
          dVar1 = a9 + a15;
          a15 = (a9 - a15) * 0.05555555555555555;
          a9 = dVar1 * 0.058823529411764705;
        }
        while (31.0 < a11 * a11 + a13 * a13) {
          dVar1 = a11 + a13;
          a13 = (a11 - a13) * 0.05555555555555555;
          a11 = dVar1 * 0.058823529411764705;
        }
        a10 = (a12 * a14 - a16 * 31.0) + 1.0;
        a12 = (a10 * a12 - a14 * a16 * 2.0) + 1.0;
        a14 = (a16 * a16 + a10 * 3.0) - 1.0;
        a16 = (((a10 + a12) - a14) - a16 * 11.0) - 1.0;
        while (24.0 < a10 * a10 + a12 * a12) {
          dVar1 = a10 + a12;
          a12 = (a10 - a12) * 0.05555555555555555;
          a10 = dVar1 * 0.058823529411764705;
        }
        while (27.0 < a14 * a14 + a16 * a16) {
          dVar1 = a14 + a16;
          a16 = (a14 - a16) * 0.05555555555555555;
          a14 = dVar1 * 0.058823529411764705;
        }
        while (29.0 < a10 * a10 + a16 * a16) {
          dVar1 = a10 + a16;
          a16 = (a10 - a16) * 0.05555555555555555;
          a10 = dVar1 * 0.058823529411764705;
        }
        while (31.0 < a12 * a12 + a14 * a14) {
          dVar1 = a12 + a14;
          a14 = (a12 - a14) * 0.05555555555555555;
          a12 = dVar1 * 0.058823529411764705;
        }
      }
      else {
        a1 = (a3 * a5 - a7 * 31.0) + 1.0;
        a3 = (a1 * a3 - a5 * a7 * 2.0) + 1.0;
        a5 = (a7 * a7 + a1 * 3.0) - 1.0;
        a7 = (((a1 + a3) - a5) - a7 * 11.0) - 1.0;
        while (24.0 < a1 * a1 + a3 * a3) {
          dVar1 = a1 + a3;
          a3 = (a1 - a3) * 0.05555555555555555;
          a1 = dVar1 * 0.058823529411764705;
        }
        while (27.0 < a5 * a5 + a7 * a7) {
          dVar1 = a5 + a7;
          a7 = (a5 - a7) * 0.05555555555555555;
          a5 = dVar1 * 0.058823529411764705;
        }
        while (29.0 < a1 * a1 + a7 * a7) {
          dVar1 = a1 + a7;
          a7 = (a1 - a7) * 0.05555555555555555;
          a1 = dVar1 * 0.058823529411764705;
        }
        while (31.0 < a3 * a3 + a5 * a5) {
          dVar1 = a3 + a5;
          a5 = (a3 - a5) * 0.05555555555555555;
          a3 = dVar1 * 0.058823529411764705;
        }
        a2 = (a4 * a6 - a8 * 31.0) + 1.0;
        a4 = (a2 * a4 - a6 * a8 * 2.0) + 1.0;
        a6 = (a8 * a8 + a2 * 3.0) - 1.0;
        a8 = (((a2 + a4) - a6) - a8 * 11.0) - 1.0;
        while (24.0 < a2 * a2 + a4 * a4) {
          dVar1 = a2 + a4;
          a4 = (a2 - a4) * 0.05555555555555555;
          a2 = dVar1 * 0.058823529411764705;
        }
        while (27.0 < a6 * a6 + a8 * a8) {
          dVar1 = a6 + a8;
          a8 = (a6 - a8) * 0.05555555555555555;
          a6 = dVar1 * 0.058823529411764705;
        }
        while (29.0 < a2 * a2 + a8 * a8) {
          dVar1 = a2 + a8;
          a8 = (a2 - a8) * 0.05555555555555555;
          a2 = dVar1 * 0.058823529411764705;
        }
        while (31.0 < a4 * a4 + a6 * a6) {
          dVar1 = a4 + a6;
          a6 = (a4 - a6) * 0.05555555555555555;
          a4 = dVar1 * 0.058823529411764705;
        }
      }
      if ((0.0 < a3) || (a12 < 0.0)) {
        a1 = (a17 * a4 - a18 * 31.0) + 1.0;
        a17 = (a1 * a17 - a4 * a18 * 2.0) + 1.0;
        a4 = (a18 * a18 + a1 * 3.0) - 1.0;
        a18 = (((a1 + a17) - a4) - a18 * 11.0) - 1.0;
        while (24.0 < a1 * a1 + a17 * a17) {
          dVar1 = a1 + a17;
          a17 = (a1 - a17) * 0.05555555555555555;
          a1 = dVar1 * 0.058823529411764705;
        }
        while (27.0 < a4 * a4 + a18 * a18) {
          dVar1 = a4 + a18;
          a18 = (a4 - a18) * 0.05555555555555555;
          a4 = dVar1 * 0.058823529411764705;
        }
        while (29.0 < a1 * a1 + a18 * a18) {
          dVar1 = a1 + a18;
          a18 = (a1 - a18) * 0.05555555555555555;
          a1 = dVar1 * 0.058823529411764705;
        }
        while (31.0 < a17 * a17 + a4 * a4) {
          dVar1 = a17 + a4;
          a4 = (a17 - a4) * 0.05555555555555555;
          a17 = dVar1 * 0.058823529411764705;
        }
        a13 = (a19 * a16 - _j * 31.0) + 1.0;
        a19 = (a13 * a19 - a16 * _j * 2.0) + 1.0;
        a16 = (_j * _j + a13 * 3.0) - 1.0;
        _j = (((a13 + a19) - a16) - _j * 11.0) - 1.0;
        while (24.0 < a13 * a13 + a19 * a19) {
          dVar1 = a13 + a19;
          a19 = (a13 - a19) * 0.05555555555555555;
          a13 = dVar1 * 0.058823529411764705;
        }
        while (27.0 < a16 * a16 + _j * _j) {
          dVar1 = a16 + _j;
          _j = (a16 - _j) * 0.05555555555555555;
          a16 = dVar1 * 0.058823529411764705;
        }
        while (29.0 < a13 * a13 + _j * _j) {
          dVar1 = a13 + _j;
          _j = (a13 - _j) * 0.05555555555555555;
          a13 = dVar1 * 0.058823529411764705;
        }
        while (31.0 < a19 * a19 + a16 * a16) {
          dVar1 = a19 + a16;
          a16 = (a19 - a16) * 0.05555555555555555;
          a19 = dVar1 * 0.058823529411764705;
        }
      }
    }
    fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
    if (tmp_a0103._4_4_ % 0x32 == 0) {
      A[0] = a1;
      A[1] = a2;
      A[2] = a3;
      A[3] = a4;
      A[4] = a5;
      A[5] = a6;
      A[6] = a7;
      A[7] = a8;
      A[8] = a9;
      A[9] = a10;
      A[10] = a11;
      A[0xb] = a12;
      A[0xc] = a13;
      A[0xd] = a14;
      A[0xe] = a15;
      A[0xf] = a16;
      A[0x10] = a17;
      A[0x11] = a18;
      A[0x12] = a19;
      A[0x13] = _j;
      print(*(int *)((long)args0 + 0x14));
    }
  }
  A[0] = a1;
  A[1] = a2;
  A[2] = a3;
  A[3] = a4;
  A[4] = a5;
  A[5] = a6;
  A[6] = a7;
  A[7] = a8;
  A[8] = a9;
  A[9] = a10;
  A[10] = a11;
  A[0xb] = a12;
  A[0xc] = a13;
  A[0xd] = a14;
  A[0xe] = a15;
  A[0xf] = a16;
  A[0x10] = a17;
  A[0x11] = a18;
  A[0x12] = a19;
  A[0x13] = _j;
  print(*(int *)((long)args0 + 0x14));
  *(undefined1 *)((long)args0 + 0x18) = 1;
  fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
  return;
}

Assistant:

static void
entry(void *args0)
{
    Args *args = (Args *) args0;
    DEF_A(0, 1, 2, 3);
    DEF_A(4, 5, 6, 7);
    DEF_A(8, 9, 10, 11);
    DEF_A(12, 13, 14, 15);
    DEF_A(16, 17, 18, 19);

    for (int i = 0; i < args->n; ++i) {
        for (int j = 0; j < 16; ++j) {
            if (j & 1) {
                MIX(0, 2, 4, 6);
                MIX(1, 3, 5, 7);
            } else {
                MIX(8, 10, 12, 14);
                MIX(9, 11, 13, 15);
            }
            if (a2 > 0 || a11 < 0) {
                MIX(0, 16, 3, 17);
                MIX(12, 18, 15, 19);
            }
        }
        fiber_switch(args->self, args->caller);
        if (i % 50 == 0) {
            STORE_ALL;
            print(args->id);
        }
    }

    STORE_ALL;
    print(args->id);
    args->done = true;
    fiber_switch(args->self, args->caller);
}